

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::GeometryHelper_Extend_PointToLine
          (X3DImporter *this,list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pPoint,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pLine)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  undefined8 extraout_RAX;
  X3DImporter *this_00;
  _List_node_base *p_Var3;
  allocator local_41;
  
  if (1 < (pPoint->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
          ._M_node._M_size) {
    p_Var1 = (pPoint->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl._M_node.super__List_node_base._M_prev;
    p_Var2 = (pPoint->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    p_Var3 = p_Var2->_M_next;
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (pLine,(value_type *)(p_Var2 + 1));
    while( true ) {
      std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (pLine,(value_type *)(p_Var3 + 1));
      if (p_Var3 == p_Var1) break;
      std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (pLine,(value_type *)(p_Var3 + 1));
      p_Var3 = p_Var3->_M_next;
    }
    return;
  }
  this_00 = (X3DImporter *)&stack0xffffffffffffffc0;
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc0,
             "GeometryHelper_Extend_PointToLine.pPoint.size() can not be less than 2.",&local_41);
  Throw_ArgOutOfRange(this_00,(string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void X3DImporter::GeometryHelper_Extend_PointToLine(const std::list<aiVector3D>& pPoint, std::list<aiVector3D>& pLine)
{
    std::list<aiVector3D>::const_iterator pit = pPoint.begin();
    std::list<aiVector3D>::const_iterator pit_last = pPoint.end();

	--pit_last;

    if ( pPoint.size() < 2 )
    {
        Throw_ArgOutOfRange( "GeometryHelper_Extend_PointToLine.pPoint.size() can not be less than 2." );
    }

	// add first point of first line.
	pLine.push_back(*pit++);
	// add internal points
	while(pit != pit_last)
	{
		pLine.push_back(*pit);// second point of previous line
		pLine.push_back(*pit);// first point of next line
		++pit;
	}
	// add last point of last line
	pLine.push_back(*pit);
}